

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

void __thiscall
llm_tokenizer_bpe_session::~llm_tokenizer_bpe_session(llm_tokenizer_bpe_session *this)

{
  llama_vocab::std::vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_>::~vector
            ((vector<llm_bigram_bpe,_std::allocator<llm_bigram_bpe>_> *)&this->work_queue);
  llama_vocab::std::_Vector_base<llm_symbol,_std::allocator<llm_symbol>_>::~_Vector_base
            (&(this->symbols_final).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>);
  llama_vocab::std::_Vector_base<llm_symbol,_std::allocator<llm_symbol>_>::~_Vector_base
            (&(this->symbols).super__Vector_base<llm_symbol,_std::allocator<llm_symbol>_>);
  return;
}

Assistant:

static void append(const llama_token token_id, std::vector<llama_token> & output)  {
        output.push_back(token_id);
    }